

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

bool __thiscall
slang::driver::Driver::processCommandFile(Driver *this,string_view fileName,bool makeRelative)

{
  pointer pbVar1;
  _List _Var2;
  bool bVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  pointer pbVar4;
  string_view argList;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string_view text;
  string_view text_00;
  path currPath;
  vector<char,_std::allocator<char>_> buffer;
  path path;
  error_code ec;
  path local_e8;
  undefined1 local_c0 [32];
  _List local_a0;
  vector<char,_std::allocator<char>_> local_98;
  pointer local_78;
  size_type sStack_70;
  path local_68;
  int local_40;
  undefined8 local_38;
  
  local_40 = 0;
  local_38 = std::_V2::system_category();
  local_e8._M_pathname._M_dataplus._M_p = (char *)fileName._M_len;
  local_e8._M_pathname._M_string_length = (size_type)fileName._M_str;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            ((path *)local_c0,(basic_string_view<char,_std::char_traits<char>_> *)&local_e8,
             auto_format);
  std::filesystem::canonical(&local_68,(error_code *)local_c0);
  std::filesystem::__cxx11::path::~path((path *)local_c0);
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_40 == 0) {
    bVar3 = OS::readFile(&local_68,&local_98);
    if (bVar3) {
      std::filesystem::__cxx11::path::path((path *)local_c0);
      if (makeRelative) {
        std::filesystem::current_path_abi_cxx11_();
        std::__cxx11::string::operator=((string *)local_c0,(string *)&local_e8);
        _Var2._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             local_a0._M_impl._M_t.
             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             ._M_t.
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
             _M_head_impl;
        local_a0._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             local_e8._M_cmpts._M_impl._M_t.
             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             ._M_t.
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
             _M_head_impl;
        local_e8._M_cmpts._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
                )0x0;
        if (_Var2._M_impl._M_t.
            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
             )0x0) {
          std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                    ((_Impl_deleter *)&local_a0,
                     (_Impl *)_Var2._M_impl._M_t.
                              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              .
                              super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                              ._M_head_impl);
        }
        std::filesystem::__cxx11::path::clear(&local_e8);
        std::filesystem::__cxx11::path::~path(&local_e8);
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::current_path(&local_e8);
        std::filesystem::__cxx11::path::~path(&local_e8);
      }
      if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        assert::assertFailed
                  ("!buffer.empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/driver/Driver.cpp"
                   ,0xfd,"bool slang::driver::Driver::processCommandFile(string_view, bool)");
      }
      local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      argList._M_len =
           (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      argList._M_str =
           local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
      bVar3 = CommandLine::parse(&this->cmdLine,argList,(ParseOptions)0x1010101);
      if (makeRelative) {
        std::filesystem::current_path((path *)local_c0);
      }
      if (!bVar3) {
        pbVar4 = (this->cmdLine).errors.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (this->cmdLine).errors.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar4 != pbVar1) {
          do {
            local_78 = (pbVar4->_M_dataplus)._M_p;
            sStack_70 = pbVar4->_M_string_length;
            fmt.size_ = 0xd;
            fmt.data_ = (char *)0x3;
            args.field_1.args_ = in_R9.args_;
            args.desc_ = (unsigned_long_long)&local_78;
            ::fmt::v9::vformat_abi_cxx11_(&local_e8._M_pathname,(v9 *)0x3ea20a,fmt,args);
            text._M_str = local_e8._M_pathname._M_dataplus._M_p;
            text._M_len = local_e8._M_pathname._M_string_length;
            OS::printE(text);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_pathname._M_dataplus._M_p != &local_e8._M_pathname.field_2) {
              operator_delete(local_e8._M_pathname._M_dataplus._M_p,
                              local_e8._M_pathname.field_2._M_allocated_capacity + 1);
            }
            pbVar4 = pbVar4 + 1;
          } while (pbVar4 != pbVar1);
        }
      }
      std::filesystem::__cxx11::path::~path((path *)local_c0);
      goto LAB_0016fe62;
    }
  }
  local_c0._0_8_ =
       (ulong)((this->diagClient).
               super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              errorColor << 0x20;
  local_c0._8_4_ = local_c0._8_4_ & 0xffffff00;
  local_c0._12_4_ = local_c0._12_4_ & 0xffffff00;
  local_c0[0x12] = '\0';
  local_c0._16_2_ = 1;
  OS::printE((OS *)local_c0,(text_style *)0x7,(string_view)ZEXT816(0x3ea017));
  fmt_00.size_ = 0xd;
  fmt_00.data_ = (char *)0x20;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)&local_e8;
  local_e8._M_pathname._M_dataplus._M_p = fileName._M_str;
  local_e8._M_pathname._M_string_length = (size_type)fileName._M_len;
  ::fmt::v9::vformat_abi_cxx11_
            ((string *)local_c0,(v9 *)"no such file or directory: \'{}\'\n",fmt_00,args_00);
  text_00._M_len._4_4_ = local_c0._12_4_;
  text_00._M_len._0_4_ = local_c0._8_4_;
  text_00._M_str = (char *)local_c0._0_8_;
  OS::printE(text_00);
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,
                    CONCAT53(local_c0._19_5_,CONCAT12(local_c0[0x12],local_c0._16_2_)) + 1);
  }
  bVar3 = false;
LAB_0016fe62:
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::filesystem::__cxx11::path::~path(&local_68);
  return bVar3;
}

Assistant:

bool Driver::processCommandFile(string_view fileName, bool makeRelative) {
    std::error_code ec;
    fs::path path = fs::canonical(widen(fileName), ec);
    std::vector<char> buffer;
    if (ec || !OS::readFile(path, buffer)) {
        OS::printE(fg(diagClient->errorColor), "error: ");
        OS::printE(fmt::format("no such file or directory: '{}'\n", fileName));
        return false;
    }

    fs::path currPath;
    if (makeRelative) {
        currPath = fs::current_path();
        fs::current_path(path.parent_path());
    }

    CommandLine::ParseOptions parseOpts;
    parseOpts.expandEnvVars = true;
    parseOpts.ignoreProgramName = true;
    parseOpts.supportComments = true;
    parseOpts.ignoreDuplicates = true;

    ASSERT(!buffer.empty());
    buffer.pop_back();

    string_view argStr(buffer.data(), buffer.size());
    bool result = cmdLine.parse(argStr, parseOpts);

    if (makeRelative)
        fs::current_path(currPath);

    if (!result) {
        for (auto& err : cmdLine.getErrors())
            OS::printE(fmt::format("{}\n", err));
        return false;
    }

    return true;
}